

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash-c.c
# Opt level: O0

uint64_t bswap64(uint64_t x)

{
  char cVar1;
  char cVar2;
  ulong uVar3;
  ulong uVar4;
  uint64_t t;
  uint64_t l;
  uint64_t h;
  uint64_t ml;
  uint64_t mh;
  uint64_t d;
  size_t i;
  uint64_t y;
  uint64_t x_local;
  
  y = x;
  for (i = 0; i < 4; i = i + 1) {
    cVar2 = (char)i;
    cVar1 = '\a' - cVar2;
    uVar3 = 0xffL << (cVar1 * '\b' & 0x3fU);
    uVar4 = 0xffL << ((byte)(i << 3) & 0x3f);
    y = (x & uVar4) << ((cVar1 - cVar2) * '\b' & 0x3fU) |
        (x & uVar3) >> ((cVar1 - cVar2) * '\b' & 0x3fU) | y & ((uVar3 | uVar4) ^ 0xffffffffffffffff)
    ;
  }
  return y;
}

Assistant:

static inline uint64_t bswap64(const uint64_t x) {
  uint64_t y = x;
  size_t i;

  for (i = 0; i < sizeof(uint64_t) >> 1; i++) {

    uint64_t d = sizeof(uint64_t) - i - 1;

    uint64_t mh = ((uint64_t)0xff) << (d << 3);
    uint64_t ml = ((uint64_t)0xff) << (i << 3);

    uint64_t h = x & mh;
    uint64_t l = x & ml;

    uint64_t t = (l << ((d - i) << 3)) | (h >> ((d - i) << 3));

    y = t | (y & ~(mh | ml));
  }

  return y;
}